

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

Offset<reflection::Object>
reflection::CreateObject
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>_> fields,
          bool is_struct,int32_t minalign,int32_t bytesize,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,Offset<flatbuffers::String> declaration_file)

{
  Offset<reflection::Object> OVar1;
  ObjectBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  ObjectBuilder::add_declaration_file(&local_40,declaration_file);
  ObjectBuilder::add_documentation(&local_40,documentation);
  ObjectBuilder::add_attributes(&local_40,attributes);
  ObjectBuilder::add_bytesize(&local_40,bytesize);
  ObjectBuilder::add_minalign(&local_40,minalign);
  ObjectBuilder::add_fields(&local_40,fields);
  ObjectBuilder::add_name(&local_40,name);
  ObjectBuilder::add_is_struct(&local_40,is_struct);
  OVar1 = ObjectBuilder::Finish(&local_40);
  return (Offset<reflection::Object>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Object> CreateObject(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::Field>>> fields = 0,
    bool is_struct = false,
    int32_t minalign = 0,
    int32_t bytesize = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    ::flatbuffers::Offset<::flatbuffers::String> declaration_file = 0) {
  ObjectBuilder builder_(_fbb);
  builder_.add_declaration_file(declaration_file);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_bytesize(bytesize);
  builder_.add_minalign(minalign);
  builder_.add_fields(fields);
  builder_.add_name(name);
  builder_.add_is_struct(is_struct);
  return builder_.Finish();
}